

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_4,_3> *mat;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in0;
  Vec4 *local_c0;
  undefined8 local_b8;
  float local_b0 [8];
  float local_90 [3];
  float local_84 [3];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Matrix<float,_4,_3> local_40;
  
  puVar1 = &local_78;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_78 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_70 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_58 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_50 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    mat = (Matrix<float,_4,_3> *)0x4;
  }
  else {
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    puVar3 = &s_constInMat3x4;
    mat = (Matrix<float,_4,_3> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar2 * 4) = *(undefined4 *)((long)puVar3 + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0xc);
      mat = (Matrix<float,_4,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 3;
    } while (mat != (Matrix<float,_4,_3> *)0x4);
  }
  negate<float,4,3>(&local_40,(MatrixCaseUtils *)&local_78,mat);
  local_84[0] = local_40.m_data.m_data[0].m_data[0];
  local_84[1] = local_40.m_data.m_data[0].m_data[1];
  local_84[2] = local_40.m_data.m_data[0].m_data[2];
  local_90[0] = local_40.m_data.m_data[1].m_data[1];
  local_90[1] = local_40.m_data.m_data[1].m_data[2];
  local_90[2] = local_40.m_data.m_data[1].m_data[3];
  local_c0 = (Vec4 *)0x0;
  local_b8 = (ulong)local_b8._4_4_ << 0x20;
  lVar2 = 0;
  do {
    *(float *)((long)&local_c0 + lVar2 * 4) = local_b0[lVar2 + 0xb] + local_b0[lVar2 + 8];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b0[5] = local_40.m_data.m_data[2].m_data[2];
  local_b0[6] = local_40.m_data.m_data[2].m_data[3];
  local_b0[7] = local_40.m_data.m_data[2].m_data[0];
  local_b0[2] = 0.0;
  local_b0[3] = 0.0;
  local_b0[4] = 0.0;
  lVar2 = 0;
  do {
    local_b0[lVar2 + 2] = *(float *)((long)&local_c0 + lVar2 * 4) + local_b0[lVar2 + 5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c0 = &evalCtx->color;
  local_b8 = 0x100000000;
  local_b0[0] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_c0 + lVar2 * 4)] = local_b0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}